

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::piece_picker::mark_as_canceled
          (piece_picker *this,piece_block block,torrent_peer *peer)

{
  download_queue_t dVar1;
  iterator dp;
  piece_pos *this_00;
  span<libtorrent::aux::piece_picker::block_info> sVar2;
  
  this_00 = (this->m_piece_map).
            super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            .
            super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            ._M_impl.super__Vector_impl_data._M_start + block.piece_index.m_val.m_val;
  dVar1 = piece_pos::download_queue(this_00);
  if (dVar1.m_val != '\x04') {
    dVar1 = piece_pos::download_queue(this_00);
    dp = find_dl_piece(this,dVar1,block.piece_index.m_val);
    sVar2 = mutable_blocks_for_piece(this,dp._M_current);
    if (*(ushort *)&sVar2.m_ptr[(long)block >> 0x20].field_0x8 < 0xc000) {
      sVar2.m_ptr[(long)block >> 0x20].peer = peer;
    }
  }
  return;
}

Assistant:

void piece_picker::mark_as_canceled(piece_block const block, aux::torrent_peer* peer)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "mark_as_cancelled( {"
			<< block.piece_index << ", " << block.block_index
			<< "} )" << std::endl;
#endif

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif
		TORRENT_ASSERT(block.block_index >= 0);
		piece_pos& p = m_piece_map[block.piece_index];

		if (p.download_queue() == piece_pos::piece_open) return;

		auto i = find_dl_piece(p.download_queue(), block.piece_index);

		TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());
		auto const binfo = mutable_blocks_for_piece(*i);
		block_info& info = binfo[block.block_index];

		if (info.state == block_info::state_finished) return;

		TORRENT_ASSERT(info.num_peers == 0);
		info.peer = peer;
		TORRENT_ASSERT(info.state == block_info::state_writing
			|| peer == nullptr);
		if (info.state == block_info::state_writing)
		{
			--i->writing;
			info.state = block_info::state_none;
			// i may be invalid after this call
			i = update_piece_state(i);

			if (i->finished + i->writing + i->requested + i->hashing == 0)
			{
				int const prev_priority = p.priority(this);
				erase_download_piece(i);
				int const new_priority = p.priority(this);

				if (m_dirty) return;
				if (new_priority == prev_priority) return;
				if (prev_priority == -1) add(block.piece_index);
				else update(prev_priority, p.index);
			}
		}
		else
		{
			TORRENT_ASSERT(info.state == block_info::state_none);
		}

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif
	}